

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

char * ucurr_nextCurrencyList(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint *puVar1;
  bool bVar2;
  char *in_RAX;
  ulong uVar3;
  
  puVar1 = (uint *)enumerator->context;
  do {
    uVar3 = (ulong)puVar1[1];
    if (0x12e < uVar3) {
      if (resultLength != (int32_t *)0x0) {
        *resultLength = 0;
      }
      return (char *)0x0;
    }
    puVar1[1] = puVar1[1] + 1;
    if ((*puVar1 == 0x7fffffff) || (bVar2 = true, (*puVar1 & ~gCurrencyList[uVar3].currType) == 0))
    {
      if (resultLength != (int32_t *)0x0) {
        *resultLength = 3;
      }
      in_RAX = gCurrencyList[uVar3].currency;
      bVar2 = false;
    }
  } while (bVar2);
  return in_RAX;
}

Assistant:

static const char* U_CALLCONV
ucurr_nextCurrencyList(UEnumeration *enumerator,
                        int32_t* resultLength,
                        UErrorCode * /*pErrorCode*/)
{
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);

    /* Find the next in the list that matches the type we are looking for. */
    while (myContext->listIdx < UPRV_LENGTHOF(gCurrencyList)-1) {
        const struct CurrencyList *currItem = &gCurrencyList[myContext->listIdx++];
        if (UCURR_MATCHES_BITMASK(currItem->currType, myContext->currType))
        {
            if (resultLength) {
                *resultLength = 3; /* Currency codes are only 3 chars long */
            }
            return currItem->currency;
        }
    }
    /* We enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}